

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::AddDeprecatedFlag
          (FieldGeneratorBase *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Descriptor *pDVar2;
  FieldDescriptor *local_28;
  _func_void_FieldDescriptor_ptr *local_20;
  
  pFVar1 = this->descriptor_;
  if (*(char *)(*(long *)(pFVar1 + 0x38) + 0x4e) == '\0') {
    if (*(once_flag **)(pFVar1 + 0x18) != (once_flag *)0x0) {
      local_20 = FieldDescriptor::TypeOnceInit;
      local_28 = pFVar1;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar1 + 0x18),&local_20,&local_28);
    }
    if (pFVar1[2] != (FieldDescriptor)0xb) {
      return;
    }
    pDVar2 = FieldDescriptor::message_type(this->descriptor_);
    if (*(char *)(*(long *)(pDVar2 + 0x20) + 0x4a) != '\x01') {
      return;
    }
  }
  io::Printer::Print<>(printer,"[global::System.ObsoleteAttribute]\n");
  return;
}

Assistant:

void FieldGeneratorBase::AddDeprecatedFlag(io::Printer* printer) {
  if (descriptor_->options().deprecated()) {
    printer->Print("[global::System.ObsoleteAttribute]\n");
  } else if (descriptor_->type() == FieldDescriptor::TYPE_MESSAGE &&
           descriptor_->message_type()->options().deprecated()) {
    printer->Print("[global::System.ObsoleteAttribute]\n");
  }
}